

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O0

void __thiscall
QDBusMenuLayoutItem::populate
          (QDBusMenuLayoutItem *this,QDBusPlatformMenu *menu,int depth,QStringList *propertyNames)

{
  bool bVar1;
  QDBusPlatformMenuItem **ppQVar2;
  QDBusPlatformMenuItem *in_RCX;
  undefined4 in_EDX;
  QDBusPlatformMenu *in_RDI;
  long in_FS_OFFSET;
  QDBusPlatformMenuItem *item;
  QList<QDBusPlatformMenuItem_*> *__range1;
  QDBusMenuLayoutItem child;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QDBusPlatformMenuItem_*> items;
  QList<QDBusPlatformMenuItem_*> *in_stack_ffffffffffffff70;
  QDBusPlatformMenuItem *this_00;
  undefined1 **ppuVar3;
  undefined4 in_stack_ffffffffffffff88;
  undefined1 local_60 [40];
  QDBusPlatformMenuItem **local_38;
  const_iterator local_30;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDBusPlatformMenu::items(in_RDI);
  ppuVar3 = &local_20;
  local_28.i = (QDBusPlatformMenuItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QDBusPlatformMenuItem_*>::begin(in_stack_ffffffffffffff70);
  local_30.i = (QDBusPlatformMenuItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QDBusPlatformMenuItem_*>::end(in_stack_ffffffffffffff70);
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QDBusPlatformMenuItem_*>::const_iterator::operator!=(&local_28,local_30);
    if (!bVar1) break;
    ppQVar2 = QList<QDBusPlatformMenuItem_*>::const_iterator::operator*(&local_28);
    this_00 = *ppQVar2;
    memset(local_60,0xaa,0x28);
    QDBusMenuLayoutItem((QDBusMenuLayoutItem *)this_00);
    populate((QDBusMenuLayoutItem *)CONCAT44(in_EDX,in_stack_ffffffffffffff88),in_RCX,
             (int)((ulong)ppuVar3 >> 0x20),(QStringList *)this_00);
    QList<QDBusMenuLayoutItem>::operator<<
              ((QList<QDBusMenuLayoutItem> *)this_00,(parameter_type)in_RDI);
    ~QDBusMenuLayoutItem((QDBusMenuLayoutItem *)this_00);
    QList<QDBusPlatformMenuItem_*>::const_iterator::operator++(&local_28);
  }
  QList<QDBusPlatformMenuItem_*>::~QList((QList<QDBusPlatformMenuItem_*> *)0xaf5faf);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuLayoutItem::populate(const QDBusPlatformMenu *menu, int depth, const QStringList &propertyNames)
{
    const auto items = menu->items();
    for (QDBusPlatformMenuItem *item : items) {
        QDBusMenuLayoutItem child;
        child.populate(item, depth - 1, propertyNames);
        m_children << child;
    }
}